

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O1

uint32 prune_leaves(dtree_node_t *node,pset_t *pset)

{
  dtree_node_t *node_00;
  dtree_node_t *node_01;
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  
  node_00 = node->y;
  if ((node_00 == (dtree_node_t *)0x0) && (node->n == (dtree_node_str *)0x0)) {
    uVar3 = 0xffffffff;
  }
  else {
    node_01 = node->n;
    if ((node_00->y == (dtree_node_str *)0x0) && (node_00->n == (dtree_node_str *)0x0)) {
      uVar1 = node_00->clust;
    }
    else {
      uVar1 = prune_leaves(node_00,pset);
    }
    if ((node_01->y == (dtree_node_str *)0x0) && (node_01->n == (dtree_node_str *)0x0)) {
      uVar2 = node_01->clust;
    }
    else {
      uVar2 = prune_leaves(node_01,pset);
    }
    uVar3 = 0xffffffff;
    if ((uVar1 != 0xffffffff) && (uVar1 == uVar2)) {
      node->y = (dtree_node_str *)0x0;
      node->n = (dtree_node_str *)0x0;
      node->clust = uVar1;
      uVar3 = uVar1;
    }
  }
  return uVar3;
}

Assistant:

uint32
prune_leaves(dtree_node_t *node,
	     pset_t *pset)
{
    dtree_node_t *y, *n;
    uint32 y_clust, n_clust;

    if (IS_LEAF(node))
	return NO_CLUST;

    y = node->y;
    n = node->n;
    
    if (!IS_LEAF(y)) {
	y_clust = prune_leaves(y, pset);
    }
    else {
	y_clust = y->clust;
    }

    if (!IS_LEAF(n)) {
	n_clust = prune_leaves(n, pset);
    }
    else {
	n_clust = n->clust;
    }


    if ((y_clust != NO_CLUST) && (y_clust == n_clust)) {
	node->y = node->n = NULL;
	node->clust = y_clust;

	return y_clust;
    }

    return NO_CLUST;
}